

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O1

FunctionSignature * __thiscall
Jinx::Impl::Library::CreateFunctionSignature
          (FunctionSignature *__return_storage_ptr__,Library *this,Visibility visibility,
          String *name)

{
  int iVar1;
  char *start;
  int iVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar4;
  Lexer lexer;
  Parser parser;
  RuntimeIPtr local_2a40;
  Lexer local_2a30;
  Parser local_29c8;
  
  this_00 = (this->m_runtime).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = this_00->_M_use_count;
    do {
      if (iVar2 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar4 = iVar2 == iVar1;
      if (bVar4) {
        this_00->_M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar4);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar4 = true;
  }
  else {
    bVar4 = this_00->_M_use_count == 0;
  }
  if (bVar4) {
    peVar3 = (element_type *)0x0;
  }
  else {
    peVar3 = (this->m_runtime).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  }
  start = (name->_M_dataplus)._M_p;
  Lexer::Lexer(&local_2a30,&peVar3->m_symbolTypeMap,start,start + name->_M_string_length,name);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  bVar4 = Lexer::Execute(&local_2a30);
  if (bVar4) {
    local_2a40.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (this->m_runtime).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    if (local_2a40.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar2 = (local_2a40.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count;
      do {
        if (iVar2 == 0) {
          local_2a40.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar1 = (local_2a40.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count;
        bVar4 = iVar2 == iVar1;
        if (bVar4) {
          (local_2a40.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count = iVar2 + 1;
          iVar1 = iVar2;
        }
        iVar2 = iVar1;
        UNLOCK();
      } while (!bVar4);
    }
    if (local_2a40.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = (local_2a40.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count == 0;
    }
    if (bVar4) {
      local_2a40.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      local_2a40.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->m_runtime).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    }
    Parser::Parser(&local_29c8,&local_2a40,&local_2a30.m_symbolList,name);
    if (local_2a40.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2a40.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    Parser::ParseFunctionSignature
              (__return_storage_ptr__,&local_29c8,(visibility == Public) + Private,&this->m_name);
    Parser::~Parser(&local_29c8);
  }
  else {
    (__return_storage_ptr__->m_staticArena).m_ptr = (char *)__return_storage_ptr__;
    __return_storage_ptr__->m_id = 0;
    __return_storage_ptr__->m_visibility = Local;
    (__return_storage_ptr__->m_libraryName)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_libraryName).field_2;
    (__return_storage_ptr__->m_libraryName)._M_string_length = 0;
    (__return_storage_ptr__->m_libraryName).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->m_parts).
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ._M_impl.super__Tp_alloc_type.m_arena = &__return_storage_ptr__->m_staticArena;
    (__return_storage_ptr__->m_parts).
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->m_parts).
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->m_parts).
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::~vector
            (&local_2a30.m_symbolList);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_2a30.m_name._M_dataplus._M_p != &local_2a30.m_name.field_2) {
    MemFree(local_2a30.m_name._M_dataplus._M_p,local_2a30.m_name.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t FunctionSignature Library::CreateFunctionSignature(Visibility visibility, const String & name) const
	{
		Lexer lexer(m_runtime.lock()->GetSymbolTypeMap(), name.c_str(), name.c_str() + name.size(), name);
		if (!lexer.Execute())
			return FunctionSignature();
		Parser parser(m_runtime.lock(), lexer.GetSymbolList(), name);
		return parser.ParseFunctionSignature(visibility == Visibility::Public ? VisibilityType::Public : VisibilityType::Private, m_name);
	}